

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

string * __thiscall
slang::syntax::SyntaxNode::toString_abi_cxx11_(string *__return_storage_ptr__,SyntaxNode *this)

{
  SyntaxPrinter *__str;
  SyntaxPrinter local_38;
  
  local_38.buffer._M_dataplus._M_p = (pointer)&local_38.buffer.field_2;
  local_38.buffer.field_2._M_allocated_capacity = 0;
  local_38.buffer.field_2._8_8_ = 0;
  local_38.buffer._M_string_length = 0;
  local_38.sourceManager = (SourceManager *)0x0;
  local_38.includeTrivia = true;
  local_38.includeMissing = false;
  local_38.includeSkipped = false;
  local_38.includeDirectives = false;
  local_38.includePreprocessed = true;
  local_38.includeComments = true;
  local_38.squashNewlines = true;
  local_38._47_1_ = 0;
  __str = SyntaxPrinter::print(&local_38,this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,&__str->buffer);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SyntaxNode::toString() const {
    return SyntaxPrinter().print(*this).str();
}